

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Gluco::OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this,int *idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  vec<unsigned_int> *pvVar6;
  long lVar7;
  long lVar8;
  
  pvVar6 = (this->occs).data;
  iVar5 = pvVar6[*idx].sz;
  if (iVar5 < 1) {
    if (iVar5 < 0) goto LAB_005c9a9a;
  }
  else {
    pvVar6 = pvVar6 + *idx;
    lVar8 = 0;
    lVar7 = 0;
    iVar5 = 0;
    do {
      bVar2 = SimpSolver::ClauseDeleted::operator()
                        (&this->deleted,(CRef *)((long)pvVar6->data + lVar8));
      if (!bVar2) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pvVar6->data[lVar4] = *(uint *)((long)pvVar6->data + lVar8);
      }
      lVar7 = lVar7 + 1;
      iVar1 = pvVar6->sz;
      lVar8 = lVar8 + 4;
    } while (lVar7 < iVar1);
    iVar3 = (int)lVar7 - iVar5;
    if (iVar1 < iVar3) {
LAB_005c9a9a:
      __assert_fail("nelems <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Vec.h"
                    ,0x42,"void Gluco::vec<unsigned int>::shrink(int) [T = unsigned int]");
    }
    if (0 < iVar3) {
      pvVar6->sz = (iVar5 + iVar1) - (int)lVar7;
    }
  }
  (this->dirty).data[*idx] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}